

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

unqlite_vfs * unqliteExportDemoVfs(void)

{
  return &unqliteExportDemoVfs::demovfs;
}

Assistant:

const unqlite_vfs *unqliteExportDemoVfs(void){
  static unqlite_vfs demovfs = {
    "unqlite_demo_vfs",           /* zName - Name of this virtual file system [i.e: Windows, UNIX, etc.] */
	1,                            /* iVersion - Structure version number (currently 1) */
	sizeof(DemoFile),             /* szOsFile - Size of subclassed unqlite_file */
	MAXPATHNAME,                  /* mxPathname -Maximum file pathname length */
    demoOpen,                     /* xOpen */
    demoDelete,                   /* xDelete */
    demoAccess,                   /* xAccess */
    demoFullPathname,             /* xFullPathname */
	0,                            /* xTmpDir */
    demoSleep,                    /* xSleep */
    demoCurrentTime,              /* xCurrentTime */
	0,                            /* xGetLastError */
  };
  return &demovfs;
}